

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

QVariant * __thiscall
QLineEdit::inputMethodQuery(QLineEdit *this,InputMethodQuery property,QVariant *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QLineEditPrivate *this_00;
  int in_EDX;
  QWidget *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QLineEditPrivate *d;
  QPointF pt_2;
  QPointF pt_1;
  QPointF pt;
  QWidgetLineControl *in_stack_fffffffffffffe70;
  QLineEditPrivate *in_stack_fffffffffffffe78;
  QLineEditPrivate *this_01;
  QWidgetLineControl *in_stack_fffffffffffffe80;
  QLineEditPrivate *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  InputMethodQuery query;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  QRect *in_stack_fffffffffffffea0;
  byte local_149;
  QRect *local_120;
  QRect *local_110;
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  QPointF local_a8;
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  QPointF local_68;
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  QPointF local_28;
  QRect local_18;
  long local_8;
  
  query = (InputMethodQuery)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QLineEdit *)0x5c6b0f);
  if (in_EDX == 1) {
    bVar1 = QWidget::isEnabled((QWidget *)0x5c6bfa);
    local_149 = 0;
    if (bVar1) {
      bVar1 = isReadOnly((QLineEdit *)in_stack_fffffffffffffe70);
      local_149 = bVar1 ^ 0xff;
    }
    ::QVariant::QVariant((QVariant *)in_RDI,(bool)(local_149 & 1));
  }
  else if (in_EDX == 2) {
    QVar4 = QLineEditPrivate::cursorRect(in_stack_fffffffffffffe78);
    local_110 = QVar4._0_8_;
    ::QVariant::QVariant((QVariant *)in_RDI,local_110);
  }
  else if (in_EDX == 4) {
    QWidget::font(in_RSI);
    QFont::operator_cast_to_QVariant(in_RDI);
  }
  else {
    if (in_EDX != 8) {
      if (in_EDX == 0x10) {
        QWidgetLineControl::surroundingText(in_stack_fffffffffffffe80);
        ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_40);
        QString::~QString((QString *)0x5c6ddc);
        goto LAB_005c7160;
      }
      if (in_EDX == 0x20) {
        selectedText((QLineEdit *)in_stack_fffffffffffffe78);
        ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_58);
        QString::~QString((QString *)0x5c6e12);
        goto LAB_005c7160;
      }
      if (in_EDX == 0x40) {
        iVar2 = maxLength((QLineEdit *)in_stack_fffffffffffffe70);
        ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
        goto LAB_005c7160;
      }
      if (in_EDX == 0x80) {
        iVar2 = QWidgetLineControl::selectionStart(in_stack_fffffffffffffe70);
        iVar3 = QWidgetLineControl::selectionEnd(in_stack_fffffffffffffe70);
        if (iVar2 == iVar3) {
          iVar2 = QWidgetLineControl::cursor((QWidgetLineControl *)this_00->control);
          ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
        }
        else {
          iVar2 = QWidgetLineControl::selectionStart(in_stack_fffffffffffffe70);
          iVar3 = QWidgetLineControl::cursor((QWidgetLineControl *)this_00->control);
          if (iVar2 == iVar3) {
            iVar2 = QWidgetLineControl::selectionEnd(in_stack_fffffffffffffe70);
            ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
          }
          else {
            iVar2 = QWidgetLineControl::selectionStart(in_stack_fffffffffffffe70);
            ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
          }
        }
        goto LAB_005c7160;
      }
      if (in_EDX != 0x400) {
        if (in_EDX == 0x800) {
          local_68.xp = -NAN;
          local_68.yp = -NAN;
          local_68.xp = (qreal)::QVariant::toPointF();
          iVar2 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
          bVar1 = QPointF::isNull((QPointF *)in_stack_fffffffffffffe70);
          if (bVar1) {
            QWidgetLineControl::cursor((QWidgetLineControl *)this_00->control);
            QLineEditPrivate::textBeforeCursor
                      (in_stack_fffffffffffffe88,(int)((ulong)this_00 >> 0x20));
            ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_98);
            QString::~QString((QString *)0x5c703a);
          }
          else {
            QPointF::x(&local_68);
            QLineEditPrivate::xToPos
                      (in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (CursorPosition)in_stack_fffffffffffffe70);
            QLineEditPrivate::textBeforeCursor(this_00,iVar2);
            ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_80);
            QString::~QString((QString *)0x5c6fe1);
          }
        }
        else if (in_EDX == 0x1000) {
          local_a8.xp = -NAN;
          local_a8.yp = -NAN;
          local_a8.xp = (qreal)::QVariant::toPointF();
          iVar2 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
          bVar1 = QPointF::isNull((QPointF *)in_stack_fffffffffffffe70);
          if (bVar1) {
            QWidgetLineControl::cursor((QWidgetLineControl *)this_00->control);
            QLineEditPrivate::textAfterCursor(in_stack_fffffffffffffe88,iVar2);
            ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_d8);
            QString::~QString((QString *)0x5c7148);
          }
          else {
            this_01 = this_00;
            QPointF::x(&local_a8);
            QLineEditPrivate::xToPos(this_01,(int)((ulong)this_00 >> 0x20),(CursorPosition)this_00);
            QLineEditPrivate::textAfterCursor(in_stack_fffffffffffffe88,iVar2);
            ::QVariant::QVariant((QVariant *)in_RDI,(QString *)local_c0);
            QString::~QString((QString *)0x5c70f4);
          }
        }
        else if (in_EDX == 0x4000) {
          local_18 = QWidgetLineControl::anchorRect(in_stack_fffffffffffffe70);
          QVar4 = QLineEditPrivate::adjustedControlRect(this_00,in_stack_fffffffffffffea0);
          local_120 = QVar4._0_8_;
          ::QVariant::QVariant((QVariant *)in_RDI,local_120);
        }
        else if (in_EDX == 0x10000) {
          bVar1 = isReadOnly((QLineEdit *)in_stack_fffffffffffffe70);
          ::QVariant::QVariant((QVariant *)in_RDI,bVar1);
        }
        else {
          QWidget::inputMethodQuery
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),query)
          ;
        }
        goto LAB_005c7160;
      }
    }
    local_28.xp = -NAN;
    local_28.yp = -NAN;
    local_28.xp = (qreal)::QVariant::toPointF();
    bVar1 = QPointF::isNull((QPointF *)in_stack_fffffffffffffe70);
    if (bVar1) {
      iVar2 = QWidgetLineControl::cursor((QWidgetLineControl *)this_00->control);
      ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
    }
    else {
      QPointF::x(&local_28);
      iVar2 = QLineEditPrivate::xToPos
                        (in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                         (CursorPosition)in_stack_fffffffffffffe70);
      ::QVariant::QVariant((QVariant *)in_RDI,iVar2);
    }
  }
LAB_005c7160:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)in_RDI;
}

Assistant:

QVariant QLineEdit::inputMethodQuery(Qt::InputMethodQuery property, QVariant argument) const
{
    Q_D(const QLineEdit);
    switch(property) {
    case Qt::ImEnabled:
        return isEnabled() && !isReadOnly();
    case Qt::ImCursorRectangle:
        return d->cursorRect();
    case Qt::ImAnchorRectangle:
        return d->adjustedControlRect(d->control->anchorRect());
    case Qt::ImFont:
        return font();
    case Qt::ImAbsolutePosition:
    case Qt::ImCursorPosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        return QVariant(d->control->cursor()); }
    case Qt::ImSurroundingText:
        return QVariant(d->control->surroundingText());
    case Qt::ImCurrentSelection:
        return QVariant(selectedText());
    case Qt::ImMaximumTextLength:
        return QVariant(maxLength());
    case Qt::ImAnchorPosition:
        if (d->control->selectionStart() == d->control->selectionEnd())
            return QVariant(d->control->cursor());
        else if (d->control->selectionStart() == d->control->cursor())
            return QVariant(d->control->selectionEnd());
        else
            return QVariant(d->control->selectionStart());
    case Qt::ImReadOnly:
        return isReadOnly();
    case Qt::ImTextBeforeCursor: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return d->textBeforeCursor(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        else
            return d->textBeforeCursor(d->control->cursor()); }
    case Qt::ImTextAfterCursor: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return d->textAfterCursor(d->xToPos(pt.x(), QTextLine::CursorBetweenCharacters));
        else
            return d->textAfterCursor(d->control->cursor()); }
    default:
        return QWidget::inputMethodQuery(property);
    }
}